

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O2

CallResult __thiscall miniros::ServiceCallback::call(ServiceCallback *this)

{
  bool bVar1;
  int iVar2;
  CallResult CVar3;
  SerializedMessage res_1;
  VoidConstPtr tracker;
  String error_string;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> local_b8;
  ServiceCallbackHelperCallParams params;
  
  bVar1 = Connection::isDropped
                    ((((this->link_).
                       super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->connection_).
                     super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bVar1) {
    return Invalid;
  }
  tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this->has_tracked_object_ == true) {
    std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *)&params,
               &this->tracked_object_);
    std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *)&params);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&params.request.buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      res_1.buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      serialization::serializeServiceResponse<unsigned_int>(&params.request,false,(uint *)&res_1);
      ServiceClientLink::processResponse
                ((this->link_).
                 super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 false,&params.request);
      SerializedMessage::~SerializedMessage(&params.request);
      CVar3 = Invalid;
      goto LAB_00245bff;
    }
  }
  params.connection_header.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  params.connection_header.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.response.message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.response.type_info = (type_info *)0x0;
  params.response.message_start = (uint8_t *)0x0;
  params.response.message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  params.response.buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.response.num_bytes = 0;
  params.request.type_info = (type_info *)0x0;
  params.response.buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  params.request.message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  params.request.message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.request.num_bytes = 0;
  params.request.message_start = (uint8_t *)0x0;
  params.request.buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  params.request.buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,
             &(this->buffer_).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>);
  SerializedMessage::SerializedMessage
            (&res_1,(shared_array_uint8_t *)&local_b8,(ulong)this->num_bytes_);
  SerializedMessage::operator=(&params.request,&res_1);
  SerializedMessage::~SerializedMessage(&res_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  std::
  __shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&res_1,
                 (__shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&((((this->link_).
                        super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->connection_).
                      super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     header_);
  std::
  __shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&params.connection_header.
               super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&res_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&res_1.buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  iVar2 = (*((this->helper_).
             super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ServiceCallbackHelper[2])();
  if ((char)iVar2 == '\0') {
    error_string.data._M_dataplus._M_p._0_4_ = 0;
    serialization::serializeServiceResponse<unsigned_int>(&res_1,false,(uint *)&error_string);
    ServiceClientLink::processResponse
              ((this->link_).
               super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               false,&res_1);
    SerializedMessage::~SerializedMessage(&res_1);
  }
  else {
    ServiceClientLink::processResponse
              ((this->link_).
               super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               true,&params.response);
  }
  CVar3 = Success;
  ServiceCallbackHelperCallParams::~ServiceCallbackHelperCallParams(&params);
LAB_00245bff:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return CVar3;
}

Assistant:

virtual CallResult call()
  {
    if (link_->getConnection()->isDropped())
    {
      return Invalid;
    }

    VoidConstPtr tracker;
    if (has_tracked_object_)
    {
      tracker = tracked_object_.lock();

      if (!tracker)
      {
        SerializedMessage res = serialization::serializeServiceResponse<uint32_t>(false, 0);
        link_->processResponse(false, res);
        return Invalid;
      }
    }

    ServiceCallbackHelperCallParams params;
    params.request = SerializedMessage(buffer_, num_bytes_);
    params.connection_header = link_->getConnection()->getHeader().getValues();
    try
    {

      bool ok = helper_->call(params);
      if (ok)
      {
        link_->processResponse(true, params.response);
      }
      else
      {
        SerializedMessage res = serialization::serializeServiceResponse<uint32_t>(false, 0);
        link_->processResponse(false, res);
      }
    }
    catch (std::exception& e)
    {
      MINIROS_ERROR("Exception thrown while processing service call: %s", e.what());
      std_msgs::String error_string;
      error_string.data = e.what();
      SerializedMessage res = serialization::serializeServiceResponse(false, error_string);
      link_->processResponse(false, res);
      return Invalid;
    }

    return Success;
  }